

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_matcher.cpp
# Opt level: O3

bool __thiscall
duckdb::InClauseExpressionMatcher::Match
          (InClauseExpressionMatcher *this,Expression *expr_p,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings)

{
  bool bVar1;
  BoundOperatorExpression *pBVar2;
  
  bVar1 = ExpressionMatcher::Match(&this->super_ExpressionMatcher,expr_p,bindings);
  if (bVar1) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(&expr_p->super_BaseExpression);
    if ((pBVar2->super_Expression).super_BaseExpression.type == COMPARE_IN) {
      bVar1 = SetMatcher::Match<duckdb::Expression,duckdb::ExpressionMatcher>
                        (&this->matchers,&pBVar2->children,bindings,this->policy);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool InClauseExpressionMatcher::Match(Expression &expr_p, vector<reference<Expression>> &bindings) {
	if (!ExpressionMatcher::Match(expr_p, bindings)) {
		return false;
	}
	auto &expr = expr_p.Cast<BoundOperatorExpression>();
	if (expr.GetExpressionType() != ExpressionType::COMPARE_IN ||
	    expr.GetExpressionType() == ExpressionType::COMPARE_NOT_IN) {
		return false;
	}
	return SetMatcher::Match(matchers, expr.children, bindings, policy);
}